

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

Value * __thiscall GlobOptBlockData::FindValue(GlobOptBlockData *this,Sym *sym)

{
  uint uVar1;
  uint uVar2;
  SparseArray<Value> *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Value **ppVVar7;
  Value *pVVar8;
  SAChunk<Value> *pSVar9;
  
  if (this->symToValueMap == (GlobHashTable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x508,"(this->symToValueMap)","this->symToValueMap");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  if (sym->m_kind != SymKindProperty) {
    if ((sym->m_kind == SymKindStack) &&
       (((((ulong)sym[1]._vptr_Sym & 0x10000) == 0 ||
         (sym = &StackSym::GetVarEquivSym((StackSym *)sym,this->globOpt->func)->super_Sym,
         (((StackSym *)sym)->super_Sym).m_kind == SymKindStack)) &&
        ((((StackSym *)sym)->field_0x1a & 4) != 0)))) {
      pSVar3 = this->globOpt->byteCodeConstantValueArray;
      uVar1 = (((StackSym *)sym)->super_Sym).m_id;
      uVar2 = pSVar3->chunkSize;
      pSVar9 = (SAChunk<Value> *)&pSVar3->firstChunk;
      while( true ) {
        pSVar9 = pSVar9->next;
        if (pSVar9 == (SAChunk<Value> *)0x0) {
          return (Value *)0x0;
        }
        if (uVar1 < pSVar9->startIndex) break;
        if (uVar1 < pSVar9->startIndex + uVar2) {
          return (Value *)(&pSVar9[1].next)[(ulong)uVar1 % (ulong)uVar2];
        }
      }
      return (Value *)0x0;
    }
    ppVVar7 = ValueHashTable<Sym_*,_Value_*>::Get
                        (this->symToValueMap,(((StackSym *)sym)->super_Sym).m_id);
    if (ppVVar7 == (Value **)0x0) {
      pVVar8 = (Value *)0x0;
    }
    else {
      pVVar8 = *ppVVar7;
    }
    return pVVar8;
  }
  pVVar8 = FindPropertyValue(this,sym->m_id);
  return pVVar8;
}

Assistant:

Value*
GlobOptBlockData::FindValue(Sym *sym)
{
    Assert(this->symToValueMap);

    if (sym->IsStackSym() && sym->AsStackSym()->IsTypeSpec())
    {
        sym = sym->AsStackSym()->GetVarEquivSym(this->globOpt->func);
    }
    else if (sym->IsPropertySym())
    {
        return this->FindPropertyValue(sym->m_id);
    }

    if (sym->IsStackSym() && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return this->globOpt->byteCodeConstantValueArray->Get(sym->m_id);
    }
    else
    {
        return FindValueFromMapDirect(sym->m_id);
    }
}